

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void OptPrint(void)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  size_t sVar3;
  uint local_14;
  uint local_10;
  int len;
  int max;
  int i;
  
  local_10 = 0;
  len = 0;
  while (op[len].label != (char *)0x0) {
    sVar3 = strlen(op[len].label);
    iVar2 = (int)sVar3;
    local_14 = iVar2 + 1;
    switch(op[len].type) {
    case OPT_FLAG:
    case OPT_FFLAG:
      break;
    case OPT_INT:
    case OPT_FINT:
      local_14 = iVar2 + 10;
      break;
    case OPT_DBL:
    case OPT_FDBL:
      local_14 = iVar2 + 7;
      break;
    case OPT_STR:
    case OPT_FSTR:
      local_14 = iVar2 + 9;
    }
    if ((int)local_10 < (int)local_14) {
      local_10 = local_14;
    }
    len = len + 1;
  }
  len = 0;
  while (__stream = errstream, op[len].label != (char *)0x0) {
    switch(op[len].type) {
    case OPT_FLAG:
    case OPT_FFLAG:
      fprintf((FILE *)errstream,"  -%-*s  %s\n",(ulong)local_10,op[len].label,op[len].message);
      break;
    case OPT_INT:
    case OPT_FINT:
      pcVar1 = op[len].label;
      sVar3 = strlen(op[len].label);
      fprintf((FILE *)__stream,"  -%s<integer>%*s  %s\n",pcVar1,(ulong)((local_10 - (int)sVar3) - 9)
              ,"",op[len].message);
      break;
    case OPT_DBL:
    case OPT_FDBL:
      pcVar1 = op[len].label;
      sVar3 = strlen(op[len].label);
      fprintf((FILE *)__stream,"  -%s<real>%*s  %s\n",pcVar1,(ulong)((local_10 - (int)sVar3) - 6),""
              ,op[len].message);
      break;
    case OPT_STR:
    case OPT_FSTR:
      pcVar1 = op[len].label;
      sVar3 = strlen(op[len].label);
      fprintf((FILE *)__stream,"  -%s<string>%*s  %s\n",pcVar1,(ulong)((local_10 - (int)sVar3) - 8),
              "",op[len].message);
    }
    len = len + 1;
  }
  return;
}

Assistant:

void OptPrint(void){
  int i;
  int max, len;
  max = 0;
  for(i=0; op[i].label; i++){
    len = lemonStrlen(op[i].label) + 1;
    switch( op[i].type ){
      case OPT_FLAG:
      case OPT_FFLAG:
        break;
      case OPT_INT:
      case OPT_FINT:
        len += 9;       /* length of "<integer>" */
        break;
      case OPT_DBL:
      case OPT_FDBL:
        len += 6;       /* length of "<real>" */
        break;
      case OPT_STR:
      case OPT_FSTR:
        len += 8;       /* length of "<string>" */
        break;
    }
    if( len>max ) max = len;
  }
  for(i=0; op[i].label; i++){
    switch( op[i].type ){
      case OPT_FLAG:
      case OPT_FFLAG:
        fprintf(errstream,"  -%-*s  %s\n",max,op[i].label,op[i].message);
        break;
      case OPT_INT:
      case OPT_FINT:
        fprintf(errstream,"  -%s<integer>%*s  %s\n",op[i].label,
          (int)(max-lemonStrlen(op[i].label)-9),"",op[i].message);
        break;
      case OPT_DBL:
      case OPT_FDBL:
        fprintf(errstream,"  -%s<real>%*s  %s\n",op[i].label,
          (int)(max-lemonStrlen(op[i].label)-6),"",op[i].message);
        break;
      case OPT_STR:
      case OPT_FSTR:
        fprintf(errstream,"  -%s<string>%*s  %s\n",op[i].label,
          (int)(max-lemonStrlen(op[i].label)-8),"",op[i].message);
        break;
    }
  }
}